

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::destroy(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
          *this,allocator_type *alloc)

{
  allocator_type *in_RDX;
  allocator_type *extraout_RDX;
  ulong i;
  
  if (((ulong)this & 7) == 0) {
    i = 0;
    do {
      if ((byte)this[10] <= i) {
        return;
      }
      value_destroy(this,i,in_RDX);
      i = i + 1;
      in_RDX = extraout_RDX;
    } while (((ulong)this & 7) == 0);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

void destroy(allocator_type *alloc) {
            for (int i = 0; i < count(); ++i) {
                value_destroy(i, alloc);
            }
        }